

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

bool __thiscall
Commands::command_handler_register::Handle
          (command_handler_register *this,string *command,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,Command_Source *from,int alias_depth)

{
  bool bVar1;
  _Alloc_hider _Var2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  const_iterator cVar8;
  const_iterator cVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator iVar10;
  _Base_ptr p_Var11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  string prefix;
  string local_148;
  _Rb_tree_node_base *local_128;
  _Rb_tree_node_base *local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (command->_M_string_length == 0) {
    iVar5 = (*from->_vptr_Command_Source[4])(from);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unknown_command","");
    I18N::Format<>(&local_50,(I18N *)(CONCAT44(extraout_var,iVar5) + 0x490),&local_148);
    (*from->_vptr_Command_Source[5])(from,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00128806:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (100 < alias_depth) {
      Console::Wrn("Command alias nested too deeply or infinitely recursive: %s",
                   (command->_M_dataplus)._M_p);
      return false;
    }
    local_118 = arguments;
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
                    *)this,command);
    p_Var12 = &(this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header;
    if ((cVar8._M_node == p_Var12) ||
       ((ulong)((long)(local_118->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_118->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) <
        (ulong)((long)cVar8._M_node[3]._M_parent - *(long *)(cVar8._M_node + 3)))) {
      cVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->aliases)._M_h,command);
      if (cVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,
                   *(long *)((long)cVar9.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur + 0x28),
                   *(long *)((long)cVar9.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur + 0x30) +
                   *(long *)((long)cVar9.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur + 0x28));
        bVar4 = Handle(this,&local_90,local_118,from,alias_depth + 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          return bVar4;
        }
        return bVar4;
      }
      p_Var11 = (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var13 = p_Var12;
      p_Var3 = p_Var12;
      if (p_Var11 != p_Var12) {
        do {
          local_128 = p_Var3;
          if ((p_Var11[4]._M_left <= (_Base_ptr)command->_M_string_length) &&
             ((_Base_ptr)command->_M_string_length < p_Var11[2]._M_parent)) {
            local_120 = p_Var12;
            std::__cxx11::string::substr((ulong)&local_148,(ulong)(p_Var11 + 2));
            std::__cxx11::string::substr((ulong)&local_110,(ulong)command);
            _Var2._M_p = local_110._M_dataplus._M_p;
            if (local_110._M_string_length == local_148._M_string_length) {
              if (local_110._M_string_length == 0) {
                bVar4 = true;
              }
              else {
                iVar5 = bcmp(local_110._M_dataplus._M_p,local_148._M_dataplus._M_p,
                             local_110._M_string_length);
                bVar4 = iVar5 == 0;
              }
            }
            else {
              bVar4 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var2._M_p != &local_110.field_2) {
              operator_delete(_Var2._M_p,local_110.field_2._M_allocated_capacity + 1);
            }
            bVar1 = false;
            if (bVar4) {
              iVar5 = (*from->_vptr_Command_Source[4])(from);
              iVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)(CONCAT44(extraout_var_01,iVar5) + 0x1f0),(key_type *)(p_Var11 + 2)
                             );
              (*from->_vptr_Command_Source[4])(from);
              if (iVar10.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                  ._M_cur == (__node_type *)0x0) {
                uVar6 = 4;
              }
              else {
                uVar6 = util::variant::GetInt
                                  ((variant *)
                                   ((long)iVar10.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                                          ._M_cur + 0x28));
                uVar6 = uVar6 & 0xff;
              }
              uVar7 = (*from->_vptr_Command_Source[*(byte *)((long)&p_Var11[4]._M_right + 1)])(from)
              ;
              if (((uVar7 & 0xff) < uVar6) ||
                 ((*(char *)&p_Var11[4]._M_right == '\x01' &&
                  (iVar5 = (*from->_vptr_Command_Source[3])(from),
                  CONCAT44(extraout_var_02,iVar5) == 0)))) goto LAB_00128a53;
              p_Var12 = p_Var11;
              p_Var13 = local_128;
              if (local_120 != local_128) {
                iVar5 = (*from->_vptr_Command_Source[4])(from);
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_110,"unknown_command","");
                I18N::Format<>(&local_f0,(I18N *)(CONCAT44(extraout_var_03,iVar5) + 0x490),
                               &local_110);
                (*from->_vptr_Command_Source[5])(from,&local_f0);
                p_Var12 = local_120;
                p_Var13 = local_128;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p,
                                  local_110.field_2._M_allocated_capacity + 1);
                }
                bVar1 = true;
              }
            }
            else {
LAB_00128a53:
              bVar1 = false;
              p_Var12 = local_120;
              p_Var13 = local_128;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar1) {
              return false;
            }
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
          p_Var3 = local_128;
        } while (p_Var11 != p_Var13);
        if (p_Var12 != p_Var13) {
          if ((ulong)((long)p_Var12[3]._M_parent - *(long *)(p_Var12 + 3)) <=
              (ulong)((long)(local_118->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_118->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)) {
            if (p_Var12[5]._M_left != (_Base_ptr)0x0) {
              local_148._M_dataplus._M_p = (pointer)from;
              (*(code *)p_Var12[5]._M_right)(p_Var12 + 5,local_118,&local_148);
              return true;
            }
            goto LAB_00128d8f;
          }
          iVar5 = (*from->_vptr_Command_Source[4])(from);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"command_not_enough_arguments","");
          I18N::Format<>(&local_b0,(I18N *)(CONCAT44(extraout_var_04,iVar5) + 0x490),&local_148);
          (*from->_vptr_Command_Source[5])(from,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p == &local_148.field_2) {
            return false;
          }
          goto LAB_00128817;
        }
      }
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unknown_command","");
      I18N::Format<>(&local_d0,(I18N *)(CONCAT44(extraout_var_05,iVar5) + 0x490),&local_148);
      (*from->_vptr_Command_Source[5])(from,&local_d0);
      local_50.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_00128806;
    }
    else {
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      iVar10 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(CONCAT44(extraout_var_00,iVar5) + 0x1f0),command);
      (*from->_vptr_Command_Source[4])(from);
      if (iVar10.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar6 = 4;
      }
      else {
        uVar6 = util::variant::GetInt
                          ((variant *)
                           ((long)iVar10.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                                  ._M_cur + 0x28));
        uVar6 = uVar6 & 0xff;
      }
      uVar7 = (*from->_vptr_Command_Source[*(byte *)((long)&cVar8._M_node[4]._M_right + 1)])(from);
      if ((uVar6 <= (uVar7 & 0xff)) &&
         ((*(char *)&cVar8._M_node[4]._M_right != '\x01' ||
          (iVar5 = (*from->_vptr_Command_Source[3])(from), CONCAT44(extraout_var_07,iVar5) != 0))))
      {
        if (cVar8._M_node[5]._M_left != (_Base_ptr)0x0) {
          local_148._M_dataplus._M_p = (pointer)from;
          (*(code *)cVar8._M_node[5]._M_right)(cVar8._M_node + 5,local_118,&local_148);
          return true;
        }
LAB_00128d8f:
        local_148._M_dataplus._M_p = (pointer)from;
        std::__throw_bad_function_call();
      }
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unknown_command","");
      I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var_06,iVar5) + 0x490),&local_148);
      (*from->_vptr_Command_Source[5])(from,&local_70);
      local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00128806;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p == &local_148.field_2) {
    return false;
  }
LAB_00128817:
  operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool command_handler_register::Handle(std::string command, const std::vector<std::string>& arguments, Command_Source* from, int alias_depth) const
{
	if (command.empty())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
		return false;
	}

	if (alias_depth > 100)
	{
		Console::Wrn("Command alias nested too deeply or infinitely recursive: %s", command.c_str());
		return false;
	}

	auto command_result = handlers.find(command);

	if (command_result != handlers.end() && command_result->second.info.arguments.size() <= arguments.size())
	{
		AdminLevel admin_req = ADMIN_HGM;
		auto admin_result = from->SourceWorld()->admin_config.find(command);

		if (admin_result != from->SourceWorld()->admin_config.end())
			admin_req = AdminLevel(int(admin_result->second));

		int access = command_result->second.info.duty_restrict ? from->SourceDutyAccess() : from->SourceAccess();

		if (access < admin_req || (command_result->second.info.require_character && !from->SourceCharacter()))
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
			return false;
		}

		command_result->second.f(arguments, from);
		return true;
	}
	else
	{
		auto alias_result = aliases.find(command);

		if (alias_result != aliases.end())
		{
			return this->Handle(alias_result->second, arguments, from, alias_depth + 1);
		}

		auto match = handlers.end();

		UTIL_CIFOREACH(handlers, handler)
		{
			if (command.length() < handler->second.info.partial_min_chars
			 || command.length() >= handler->second.info.name.length())
				continue;

			std::string prefix = handler->second.info.name.substr(0, std::max(command.length(), handler->second.info.partial_min_chars));

			if (command.substr(0, prefix.length()) == prefix)
			{
				AdminLevel admin_req = ADMIN_HGM;
				auto admin_result = from->SourceWorld()->admin_config.find(handler->second.info.name);

				if (admin_result != from->SourceWorld()->admin_config.end())
					admin_req = AdminLevel(int(admin_result->second));

				int access = handler->second.info.duty_restrict ? from->SourceDutyAccess() : from->SourceAccess();

				if (access < admin_req || (handler->second.info.require_character && !from->SourceCharacter()))
					continue;

				// Ambiguous abbreviation
				if (match != handlers.end())
				{
					from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
					return false;
				}

				match = handler;
			}
		}

		if (match != handlers.end())
		{
			if (match->second.info.arguments.size() > arguments.size())
			{
				from->ServerMsg(from->SourceWorld()->i18n.Format("command_not_enough_arguments"));
				return false;
			}

			match->second.f(arguments, from);
			return true;
		}
	}

	from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
	return false;
}